

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Minimum(MinimumForm2 Minimum)

{
  uint8_t value;
  byte bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  byte *pbVar6;
  const_reference pvVar7;
  code *in_RDI;
  Image *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined2 uVar8;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  uVar8 = (undefined2)((ulong)in_stack_ffffffffffffff60 >> 0x30);
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff5c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
             (uint8_t)((ushort)uVar8 >> 8),(uint8_t)uVar8);
  Test_Helper::uniformImages(in_stack_00000008,unaff_retaddr);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dccad);
  this = &local_38;
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,2);
  (*local_8)(pvVar3,pvVar4,pvVar5);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_38,2);
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  uVar2 = (uint)*pbVar6;
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  if ((int)uVar2 < (int)(uint)*pbVar6) {
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
    value = *pvVar7;
  }
  else {
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
    value = *pvVar7;
  }
  bVar1 = Unit_Test::verifyImage(pvVar3,value);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form2_Minimum(MinimumForm2 Minimum)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image = uniformImages( intensity );

        Minimum( image[0], image[1], image[2] );

        return verifyImage( image[2], intensity[0] < intensity[1] ? intensity[0] : intensity[1] );
    }